

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_array_suite.cpp
# Opt level: O2

void api_suite::api_clear(void)

{
  size_type local_68;
  undefined4 local_5c;
  circular_array<int,_4UL> data;
  
  data.super_circular_view<int,_4UL>.member.data = (pointer)&data;
  data.super_circular_view<int,_4UL>.member.size = 0;
  data.super_circular_view<int,_4UL>.member.next = 4;
  vista::circular_view<int,_4UL>::push_back(&data.super_circular_view<int,_4UL>,0xb);
  local_68 = data.super_circular_view<int,_4UL>.member.size;
  local_5c = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("data.size()","1",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_array_suite.cpp"
             ,0xa9,"void api_suite::api_clear()",&local_68,&local_5c);
  data.super_circular_view<int,_4UL>.member.size = 0;
  local_68 = 0;
  data.super_circular_view<int,_4UL>.member.next = 4;
  local_5c = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("data.size()","0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_array_suite.cpp"
             ,0xab,"void api_suite::api_clear()",&local_68,&local_5c);
  return;
}

Assistant:

void api_clear()
{
    circular_array<int, 4> data;
    data.push_back(11);
    BOOST_TEST_EQ(data.size(), 1);
    data.clear();
    BOOST_TEST_EQ(data.size(), 0);
}